

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int2str.hpp
# Opt level: O1

char * int2str::impl::detail<10000ull>::convert<char*>(number_t x,char *iter)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (x < 10000) {
    if (x < 1000) {
      if (x < 100) {
        if (x < 10) {
          *iter = (byte)x | 0x30;
          pcVar4 = iter + 1;
        }
        else {
          bVar2 = (byte)(x / 10);
          *iter = bVar2 | 0x30;
          iter[1] = (byte)x + bVar2 * -10 + '0';
          pcVar4 = iter + 2;
        }
      }
      else {
        *iter = (byte)(x / 100) | 0x30;
        uVar3 = x % 100;
        if (uVar3 < 10) {
          iter[1] = '0';
          bVar2 = (byte)uVar3 | 0x30;
        }
        else {
          cVar1 = (char)(uVar3 / 10);
          iter[1] = cVar1 + '0';
          bVar2 = (byte)uVar3 + cVar1 * -10 + 0x30;
        }
        iter[2] = bVar2;
        pcVar4 = iter + 3;
      }
    }
    else {
      *iter = (char)(x / 1000) + '0';
      uVar3 = x % 1000;
      if (uVar3 < 100) {
        iter[1] = '0';
        if (uVar3 < 10) {
          iter[2] = '0';
          bVar2 = (byte)uVar3 | 0x30;
        }
        else {
          bVar2 = (byte)(uVar3 / 10);
          iter[2] = bVar2 | 0x30;
          bVar2 = (byte)uVar3 + bVar2 * -10 + 0x30;
        }
        iter[3] = bVar2;
      }
      else {
        iter[1] = (char)(uVar3 / 100) + '0';
        uVar3 = uVar3 % 100;
        if (uVar3 < 10) {
          iter[2] = '0';
          bVar2 = (byte)uVar3 | 0x30;
        }
        else {
          cVar1 = (char)(uVar3 / 10);
          iter[2] = cVar1 + '0';
          bVar2 = (byte)uVar3 + cVar1 * -10 + 0x30;
        }
        iter[3] = bVar2;
      }
      pcVar4 = iter + 4;
    }
    return pcVar4;
  }
  pcVar4 = convert_step<char*>(x,iter);
  return pcVar4;
}

Assistant:

inline static Iter convert(number_t x, Iter iter)
    {
        if (N > x)
            return detail<N / 10u>::convert(x, iter);
        return detail<N>::convert_step(x, iter);
    }